

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *param,
          reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_2,
          int *param_3)

{
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  int *param_local_2;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_local_1;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *param_local;
  AsyncQueue<nrg::TimedExecution> *this_local;
  
  lock._M_device = (mutex_type *)param_3;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->guard_);
  TimedExecution::push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>
            (&this->queue_,param,param_2,(int *)lock._M_device);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }